

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDebugFrame::dump
          (DWARFDebugFrame *this,raw_ostream *OS,MCRegisterInfo *MRI,Optional<unsigned_long> Offset)

{
  pointer puVar1;
  FrameEntry *pFVar2;
  unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_> *Entry;
  pointer puVar3;
  StringRef Str;
  
  if (((undefined1  [16])Offset.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    Str.Length = 1;
    Str.Data = "\n";
    raw_ostream::operator<<(OS,Str);
    puVar1 = (this->Entries).
             super__Vector_base<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (this->Entries).
                  super__Vector_base<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1)
    {
      pFVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::dwarf::FrameEntry_*,_std::default_delete<llvm::dwarf::FrameEntry>_>
               .super__Head_base<0UL,_llvm::dwarf::FrameEntry_*,_false>._M_head_impl;
      (*pFVar2->_vptr_FrameEntry[2])(pFVar2,OS,MRI,(ulong)this->IsEH);
    }
  }
  else {
    pFVar2 = getEntryAtOffset(this,Offset.Storage.field_0.value);
    if (pFVar2 != (FrameEntry *)0x0) {
      (*pFVar2->_vptr_FrameEntry[2])(pFVar2,OS,MRI,(ulong)this->IsEH,pFVar2->_vptr_FrameEntry[2]);
      return;
    }
  }
  return;
}

Assistant:

void DWARFDebugFrame::dump(raw_ostream &OS, const MCRegisterInfo *MRI,
                           Optional<uint64_t> Offset) const {
  if (Offset) {
    if (auto *Entry = getEntryAtOffset(*Offset))
      Entry->dump(OS, MRI, IsEH);
    return;
  }

  OS << "\n";
  for (const auto &Entry : Entries)
    Entry->dump(OS, MRI, IsEH);
}